

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

CollSeq * sqlite3FindCollSeq(sqlite3 *db,u8 enc,char *zName,int create)

{
  CollSeq *local_30;
  CollSeq *pColl;
  int create_local;
  char *zName_local;
  u8 enc_local;
  sqlite3 *db_local;
  
  if (zName == (char *)0x0) {
    local_30 = db->pDfltColl;
  }
  else {
    local_30 = findCollSeqEntry(db,zName,create);
    if (local_30 != (CollSeq *)0x0) {
      local_30 = local_30 + (int)(enc - 1);
    }
  }
  return local_30;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3FindCollSeq(
  sqlite3 *db,          /* Database connection to search */
  u8 enc,               /* Desired text encoding */
  const char *zName,    /* Name of the collating sequence.  Might be NULL */
  int create            /* True to create CollSeq if doesn't already exist */
){
  CollSeq *pColl;
  assert( SQLITE_UTF8==1 && SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
  assert( enc>=SQLITE_UTF8 && enc<=SQLITE_UTF16BE );
  if( zName ){
    pColl = findCollSeqEntry(db, zName, create);
    if( pColl ) pColl += enc-1;
  }else{
    pColl = db->pDfltColl;
  }
  return pColl;
}